

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

int line_x1y1_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value *pAVar4;
  int y1;
  int x1;
  Places where;
  Am_Object source_obj;
  Am_Object *self_local;
  
  source_obj.data = (Am_Object_Data *)self;
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)INPUT_1);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffe0,pAVar3);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)source_obj.data,(ulong)INPUT_PLACE);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar1 == 3) {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,0x66);
    iVar1 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,100);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    self_local._4_4_ = iVar1 + -2 + iVar2;
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,0x67);
    iVar1 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,0x65);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    Am_Object::Set((ushort)source_obj.data,0x8c,(ulong)(uint)(iVar1 / 2 + iVar2));
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, line_x1y1) {
  Am_Object source_obj = self.Get(INPUT_1);
  Places where = (Places)(int)self.Get(INPUT_PLACE);
  if (where == center_right) {
    int x1 = (int)source_obj.Get(Am_WIDTH) + (int)source_obj.Get(Am_LEFT)-2;
    int y1 = (int)source_obj.Get(Am_HEIGHT) / 2 + (int)source_obj.Get(Am_TOP);
    self.Set(Am_Y1, y1);
    return x1;
  }
  return 0;
}